

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmAddLinkDirectoryForTarget(void *arg,char *tgt,char *d)

{
  cmTarget *this;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,tgt,&local_39);
  this = cmMakefile::FindLocalNonAliasTarget((cmMakefile *)arg,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (this == (cmTarget *)0x0) {
    cmSystemTools::Error
              ("Attempt to add link directories to non-existent target: ",tgt," for directory ",d);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,d,&local_39);
    cmTarget::AddLinkDirectory(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void CCONV cmAddLinkDirectoryForTarget(void* arg, const char* tgt,
                                       const char* d)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmTarget* t = mf->FindLocalNonAliasTarget(tgt);
  if (!t) {
    cmSystemTools::Error(
      "Attempt to add link directories to non-existent target: ", tgt,
      " for directory ", d);
    return;
  }
  t->AddLinkDirectory(d);
}